

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O1

int buffer_pwrite(int n,char *s,uint len)

{
  unsigned_long uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  DIR *__dirp;
  dirent *pdVar7;
  ulong uVar8;
  uint uVar9;
  logdir *plVar10;
  char *s_00;
  char oldest [30];
  undefined2 local_58 [13];
  undefined1 local_3d;
  
  uVar9 = len;
  if (dir[n].sizemax != 0) {
    if (dir[n].sizemax <= dir[n].size) {
      rotate(dir + n);
    }
    uVar8 = dir[n].sizemax - dir[n].size;
    uVar9 = (uint)uVar8;
    if (len <= uVar8) {
      uVar9 = len;
    }
  }
  sVar5 = write(dir[n].fdcur,s,(ulong)uVar9);
  if ((int)sVar5 == -1) {
    piVar6 = __errno_location();
    do {
      if ((*piVar6 == 0x1c) && (dir[n].nmin < dir[n].nmax)) {
        iVar2 = fchdir(dir[n].fddir);
        while (iVar2 == -1) {
          strerr_warn("svlogd: pausing: ","unable to change directory, want remove old logfile",": "
                      ,dir[n].name,": ",(char *)0x0,&strerr_sys);
          sleep(3);
          iVar2 = fchdir(dir[n].fddir);
        }
        local_58[0] = 0x41;
        local_3d = 0;
        __dirp = opendir(".");
        while (__dirp == (DIR *)0x0) {
          strerr_warn("svlogd: pausing: ","unable to open directory, want remove old logfile",": ",
                      dir[n].name,": ",(char *)0x0,&strerr_sys);
          sleep(3);
          __dirp = opendir(".");
        }
        *piVar6 = 0;
        pdVar7 = readdir(__dirp);
        if (pdVar7 == (dirent *)0x0) {
          uVar8 = 0;
        }
        else {
          iVar2 = 0;
          do {
            if (pdVar7->d_name[0] == '@') {
              s_00 = pdVar7->d_name;
              uVar3 = str_len(s_00);
              if (uVar3 == 0x1b) {
                iVar2 = iVar2 + 1;
                iVar4 = str_diff(s_00,(char *)local_58);
                if (iVar4 < 0) {
                  byte_copy((char *)local_58,0x1b,s_00);
                }
              }
            }
            pdVar7 = readdir(__dirp);
          } while (pdVar7 != (dirent *)0x0);
          uVar8 = (ulong)iVar2;
        }
        if (*piVar6 != 0) {
          strerr_warn("svlogd: warning: ","unable to read directory, want remove old logfile",": ",
                      dir[n].name,": ",(char *)0x0,&strerr_sys);
        }
        closedir(__dirp);
        *piVar6 = 0x1c;
        if ((dir[n].nmin < uVar8) && ((char)local_58[0] == '@')) {
          strerr_warn("svlogd: warning: ","out of disk space, delete: ",dir[n].name,"/",
                      (char *)local_58,(char *)0x0,(strerr *)0x0);
          *piVar6 = 0;
          iVar2 = unlink((char *)local_58);
          if (iVar2 == -1) {
            strerr_warn("svlogd: warning: ","unable to unlink oldest logfile",": ",dir[n].name,": ",
                        (char *)0x0,&strerr_sys);
            *piVar6 = 0x1c;
          }
          iVar2 = fchdir(fdwdir);
          while (iVar2 == -1) {
            strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                        (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
            sleep(3);
            iVar2 = fchdir(fdwdir);
          }
        }
      }
      if (*piVar6 != 0) {
        strerr_warn("svlogd: pausing: ","unable to write to current",": ",dir[n].name,": ",
                    (char *)0x0,&strerr_sys);
        sleep(3);
      }
      sVar5 = write(dir[n].fdcur,s,(ulong)uVar9);
    } while ((int)sVar5 == -1);
  }
  plVar10 = dir;
  dir[n].size = dir[n].size + (long)(int)sVar5;
  uVar1 = plVar10[n].sizemax;
  if (((uVar1 != 0) && (s[(sVar5 << 0x20) + -0x100000000 >> 0x20] == '\n')) &&
     (plVar10 = plVar10 + n, uVar1 - linemax <= plVar10->size)) {
    rotate(plVar10);
  }
  return (int)sVar5;
}

Assistant:

int buffer_pwrite(int n, char *s, unsigned int len) {
  int i;

  if ((dir +n)->sizemax) {
    if ((dir +n)->size >= (dir +n)->sizemax) rotate(dir +n);
    if (len > ((dir +n)->sizemax -(dir +n)->size))
      len =(dir +n)->sizemax -(dir +n)->size;
  }
  while ((i =write((dir +n)->fdcur, s, len)) == -1) {
    if ((errno == ENOSPC) && ((dir +n)->nmin < (dir +n)->nmax)) {
      DIR *d;
      direntry *f;
      char oldest[FMT_PTIME];
      int j =0;

      while (fchdir((dir +n)->fddir) == -1)
        pause2("unable to change directory, want remove old logfile",
               (dir +n)->name);
      oldest[0] ='A'; oldest[1] =oldest[27] =0;
      while (! (d =opendir(".")))
        pause2("unable to open directory, want remove old logfile",
               (dir +n)->name);
      errno =0;
      while ((f =readdir(d)))
        if ((f->d_name[0] == '@') && (str_len(f->d_name) == 27)) {
          ++j;
          if (str_diff(f->d_name, oldest) < 0)
            byte_copy(oldest, 27, f->d_name);
        }
      if (errno) warn2("unable to read directory, want remove old logfile",
                       (dir +n)->name);
      closedir(d);
      errno =ENOSPC;
      if (j > (dir +n)->nmin)
        if (*oldest == '@') {
          strerr_warn5(WARNING, "out of disk space, delete: ", (dir +n)->name,
                       "/", oldest, 0);
          errno =0;
          if (unlink(oldest) == -1) {
            warn2("unable to unlink oldest logfile", (dir +n)->name);
            errno =ENOSPC;
          }
          while (fchdir(fdwdir) == -1)
            pause1("unable to change to initial working directory");
        }
    }
    if (errno) pause2("unable to write to current", (dir +n)->name);
  }

  (dir +n)->size +=i;
  if ((dir +n)->sizemax)
    if (s[i -1] == '\n')
      if ((dir +n)->size >= ((dir +n)->sizemax -linemax)) rotate(dir +n);
  return(i);
}